

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestLogger::ColumnCountMismatch
          (SQLLogicTestLogger *this,MaterializedQueryResult *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result_values_string,idx_t expected_column_count,bool row_wise)

{
  ostream *poVar1;
  void *pvVar2;
  ulong uVar3;
  ulong in_RCX;
  SQLLogicTestLogger *in_RDI;
  byte in_R8B;
  undefined1 unaff_retaddr;
  idx_t in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_00000010;
  MaterializedQueryResult *in_stack_00000018;
  SQLLogicTestLogger *in_stack_00000020;
  SQLLogicTestLogger *in_stack_00000090;
  string *in_stack_ffffffffffffff88;
  allocator local_49;
  string local_48 [39];
  byte local_21;
  ulong local_20;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Wrong column count in query!",&local_49);
  PrintErrorHeader(in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Expected ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,termcolor::bold);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,local_20);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,termcolor::reset);
  poVar1 = std::operator<<(poVar1," columns, but got ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,termcolor::bold);
  uVar3 = duckdb::BaseQueryResult::ColumnCount();
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,uVar3);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,termcolor::reset);
  poVar1 = std::operator<<(poVar1," columns");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PrintLineSep();
  PrintSQL(in_stack_00000090);
  PrintLineSep();
  PrintResultError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                   (bool)unaff_retaddr);
  return;
}

Assistant:

void SQLLogicTestLogger::ColumnCountMismatch(MaterializedQueryResult &result,
                                             const vector<string> &result_values_string, idx_t expected_column_count,
                                             bool row_wise) {
	PrintErrorHeader("Wrong column count in query!");
	std::cerr << "Expected " << termcolor::bold << expected_column_count << termcolor::reset << " columns, but got "
	          << termcolor::bold << result.ColumnCount() << termcolor::reset << " columns" << std::endl;
	PrintLineSep();
	PrintSQL();
	PrintLineSep();
	PrintResultError(result, result_values_string, expected_column_count, row_wise);
}